

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  float lhs;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int column_n;
  float row_height;
  ImGuiTable *table;
  ImGuiContext *g;
  ImVec2 in_stack_ffffffffffffffe0;
  int i;
  ImGuiContext *pIVar4;
  
  pIVar2 = GImGui->CurrentTable;
  lhs = GImGui->FontSize;
  pIVar4 = GImGui;
  for (i = 0; i < pIVar2->ColumnsCount; i = i + 1) {
    if (((pIVar2->EnabledMaskByIndex[i >> 5] & 1 << ((byte)i & 0x1f)) != 0) &&
       (pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,i),
       (pIVar3->Flags & 0x1000U) == 0)) {
      TableGetColumnName((ImGuiTable *)CONCAT44(lhs,i),(int)in_stack_ffffffffffffffe0.y);
      in_stack_ffffffffffffffe0 =
           CalcTextSize(in_stack_00000008,unaff_retaddr,SUB81((ulong)pIVar4 >> 0x38,0),
                        SUB84(pIVar4,0));
      lhs = ImMax<float>(lhs,in_stack_ffffffffffffffe0.y);
    }
  }
  fVar1 = (pIVar4->Style).CellPadding.y;
  return fVar1 + fVar1 + lhs;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float row_height = g.FontSize;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if ((table->Columns[column_n].Flags & ImGuiTableColumnFlags_NoHeaderLabel) == 0)
                row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(table, column_n)).y);
    return row_height + g.Style.CellPadding.y * 2.0f;
}